

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O3

void __thiscall
PoolResource<128UL,_8UL>::Deallocate
          (PoolResource<128UL,_8UL> *this,void *p,size_t bytes,size_t alignment)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bytes < 0x81 && alignment < 9) {
    lVar2 = (bytes + 7 >> 3) + (ulong)(bytes == 0);
    *(ListNode **)p = (this->m_free_lists)._M_elems[lVar2];
    (this->m_free_lists)._M_elems[lVar2] = (ListNode *)p;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(p,alignment);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Deallocate(void* p, std::size_t bytes, std::size_t alignment) noexcept
    {
        if (IsFreeListUsable(bytes, alignment)) {
            const std::size_t num_alignments = NumElemAlignBytes(bytes);
            // put the memory block into the linked list. We can placement construct the FreeList
            // into the memory since we can be sure the alignment is correct.
            PlacementAddToList(p, m_free_lists[num_alignments]);
        } else {
            // Can't use the pool => forward deallocation to ::operator delete().
            ::operator delete (p, std::align_val_t{alignment});
        }
    }